

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O0

int xmlUCSIsCatNl(int code)

{
  undefined1 local_d;
  int code_local;
  
  if (((((code < 0x16ee) || (local_d = true, 0x16f0 < code)) &&
       ((code < 0x2160 || (local_d = true, 0x2183 < code)))) && (local_d = true, code != 0x3007)) &&
     (((code < 0x3021 || (local_d = true, 0x3029 < code)) &&
      ((code < 0x3038 || (local_d = true, 0x303a < code)))))) {
    local_d = code == 0x1034a;
  }
  return (int)local_d;
}

Assistant:

int
xmlUCSIsCatNl(int code) {
    return(((code >= 0x16ee) && (code <= 0x16f0)) ||
           ((code >= 0x2160) && (code <= 0x2183)) ||
           (code == 0x3007) ||
           ((code >= 0x3021) && (code <= 0x3029)) ||
           ((code >= 0x3038) && (code <= 0x303a)) ||
           (code == 0x1034a));
}